

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usecase_test.cc
# Opt level: O2

void __thiscall SnapHandlePool::~SnapHandlePool(SnapHandlePool *this)

{
  ~SnapHandlePool(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~SnapHandlePool() {
        fdb_status status;
        mutex_lock(&snaplock);
        for (size_t i = 0; i < snap_pool_vector.size(); ++i) {
            PoolEntry *pe = snap_pool_vector.at(i);
            if (pe) {
                status = fdb_kvs_close(pe->db);
                fdb_assert(status == FDB_RESULT_SUCCESS,
                           status, FDB_RESULT_SUCCESS);
                delete pe;
            }
        }
        snap_pool_vector.clear();
        mutex_unlock(&snaplock);

        mutex_destroy(&snaplock);
    }